

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledSetElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
          *playout,PropertyOperationFlags flags)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this_00;
  Var value;
  Var value_00;
  Var value_01;
  
  this_00 = *(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8);
  IVar1 = this_00->implicitCallFlags;
  ThreadContext::ClearImplicitCallFlags(this_00);
  value = *(Var *)(this + (ulong)(playout->
                                 super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>)
                                 .Instance * 8 + 0x160);
  ValidateRegValue(this,value,false,true);
  value_00 = *(Var *)(this + (ulong)(playout->
                                    super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                                    ).Element * 8 + 0x160);
  ValidateRegValue(this,value_00,false,true);
  value_01 = *(Var *)(this + (ulong)(playout->
                                    super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                                    ).Value * 8 + 0x160);
  ValidateRegValue(this,value_01,false,true);
  ProfilingHelpers::ProfiledStElem
            (value,value_00,value_01,*(FunctionBody **)(this + 0x88),playout->profileId,flags,
             SUB41((*(ushort *)(this + 0xd4) & 0x10) >> 4,0),
             (bool)((byte)*(ushort *)(this + 0xd4) >> 7));
  this[0xd4] = (InterpreterStackFrame)((byte)this[0xd4] & 0x6f);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  this_00->implicitCallFlags = this_00->implicitCallFlags | IVar1;
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledSetElementI(
        const unaligned OpLayoutDynamicProfile<T>* playout,
        PropertyOperationFlags flags)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        ProfilingHelpers::ProfiledStElem(
            GetReg(playout->Instance),
            GetReg(playout->Element),
            GetReg(playout->Value),
            m_functionBody,
            playout->profileId,
            flags,
            this->TestFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArrayAccessHelperCall),
            this->TestFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization));

        this->ClearFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArrayAccessHelperCall | InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }